

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_table.cpp
# Opt level: O2

string * __thiscall
duckdb::Transformer::TransformCollation_abi_cxx11_
          (string *__return_storage_ptr__,Transformer *this,
          optional_ptr<duckdb_libpgquery::PGCollateClause,_true> collate)

{
  PGCollateClause *pPVar1;
  PGValue *pPVar2;
  ParserException *this_00;
  PGList *pPVar3;
  optional_ptr<duckdb_libpgquery::PGValue,_true> pgvalue;
  optional_ptr<duckdb_libpgquery::PGCollateClause,_true> collate_local;
  string collation_argument;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (collate.ptr != (PGCollateClause *)0x0) {
    collate_local = collate;
    pPVar1 = optional_ptr<duckdb_libpgquery::PGCollateClause,_true>::operator->(&collate_local);
    pPVar3 = pPVar1->collname;
    while (pPVar3 = (PGList *)pPVar3->head, pPVar3 != (PGList *)0x0) {
      pgvalue.ptr = *(PGValue **)pPVar3;
      pPVar2 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&pgvalue);
      if (pPVar2->type != T_PGString) {
        this_00 = (ParserException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&collation_argument,"Expected a string as collation type!",
                   (allocator *)&local_50);
        ParserException::ParserException(this_00,&collation_argument);
        __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar2 = optional_ptr<duckdb_libpgquery::PGValue,_true>::operator->(&pgvalue);
      ::std::__cxx11::string::string
                ((string *)&collation_argument,(pPVar2->val).str,(allocator *)&local_50);
      if (__return_storage_ptr__->_M_string_length == 0) {
        ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      }
      else {
        ::std::operator+(&local_50,".",&collation_argument);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      ::std::__cxx11::string::~string((string *)&collation_argument);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Transformer::TransformCollation(optional_ptr<duckdb_libpgquery::PGCollateClause> collate) {
	if (!collate) {
		return string();
	}
	string collation;
	for (auto c = collate->collname->head; c != nullptr; c = lnext(c)) {
		auto pgvalue = PGPointerCast<duckdb_libpgquery::PGValue>(c->data.ptr_value);
		if (pgvalue->type != duckdb_libpgquery::T_PGString) {
			throw ParserException("Expected a string as collation type!");
		}
		auto collation_argument = string(pgvalue->val.str);
		if (collation.empty()) {
			collation = collation_argument;
		} else {
			collation += "." + collation_argument;
		}
	}
	return collation;
}